

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *
make_word<char16_t,std::__cxx11::u16string>
          (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
           *__return_storage_ptr__,size_t length,char16_t delim)

{
  initializer_list<char16_t> __l;
  allocator<char16_t> local_53;
  char16_t local_52;
  iterator local_50;
  size_type local_48;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_40;
  char16_t local_1a;
  size_t sStack_18;
  char16_t delim_local;
  size_t length_local;
  
  local_50 = &local_52;
  local_48 = 1;
  local_52 = delim;
  local_1a = delim;
  sStack_18 = length;
  length_local = (size_t)__return_storage_ptr__;
  std::allocator<char16_t>::allocator(&local_53);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::__cxx11::u16string::u16string((u16string *)&local_40,__l,&local_53);
  make_word<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_nullptr>
            (__return_storage_ptr__,&local_40,sStack_18);
  std::__cxx11::u16string::~u16string((u16string *)&local_40);
  std::allocator<char16_t>::~allocator(&local_53);
  return __return_storage_ptr__;
}

Assistant:

ResultT make_word(size_t length = 8, T delim = default_delim<T>) {
	return make_word<T, ResultT>(std::basic_string<T>{ delim }, length);
}